

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

FILE * open_module(char *name,char *search_dir)

{
  FILE *pFVar1;
  int iVar2;
  DIR *__dirp;
  int *piVar3;
  char *pcVar4;
  dirent *pdVar5;
  size_t sVar6;
  size_t sVar7;
  FILE *local_40;
  FILE *ret;
  char *path;
  dirent *dirent;
  DIR *dir;
  char *search_dir_local;
  char *name_local;
  
  local_40 = (FILE *)0x0;
  __dirp = opendir(search_dir);
  pFVar1 = _stderr;
  if (__dirp == (DIR *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar1,"Opening the directory \"%s\" failed (%s).\n",search_dir,pcVar4);
    name_local = (char *)0x0;
  }
  else {
    do {
      do {
        pdVar5 = readdir(__dirp);
        if (pdVar5 == (dirent *)0x0) goto LAB_00104238;
        sVar6 = strlen(name);
        iVar2 = strncmp(pdVar5->d_name,name,sVar6);
      } while ((iVar2 != 0) ||
              ((sVar6 = strlen(name), pdVar5->d_name[sVar6] != '.' &&
               (sVar6 = strlen(name), pdVar5->d_name[sVar6] != '@'))));
      sVar6 = strlen(pdVar5->d_name);
      iVar2 = strcmp(pdVar5->d_name + (sVar6 - 5),".yang");
    } while (iVar2 != 0);
    sVar6 = strlen(search_dir);
    sVar7 = strlen(pdVar5->d_name);
    pcVar4 = (char *)malloc(sVar6 + sVar7 + 2);
    pFVar1 = _stderr;
    if (pcVar4 == (char *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(pFVar1,"Memory allocation error (%s).\n",pcVar4);
    }
    else {
      sprintf(pcVar4,"%s/%s",search_dir,pdVar5->d_name);
      local_40 = fopen(pcVar4,"r");
      free(pcVar4);
      pFVar1 = _stderr;
      if (local_40 == (FILE *)0x0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"Opening file \"%s\" failed (%s).\n",pdVar5->d_name,pcVar4);
      }
    }
LAB_00104238:
    closedir(__dirp);
    name_local = (char *)local_40;
  }
  return (FILE *)name_local;
}

Assistant:

static FILE *
open_module(const char *name, const char *search_dir)
{
    DIR *dir;
    struct dirent *dirent;
    char *path;
    FILE *ret = NULL;

    dir = opendir(search_dir);
    if (!dir) {
        fprintf(stderr, "Opening the directory \"%s\" failed (%s).\n", search_dir, strerror(errno));
        return NULL;
    }

    while ((dirent = readdir(dir))) {
        if (!strncmp(dirent->d_name, name, strlen(name))
                && ((dirent->d_name[strlen(name)] == '.') || (dirent->d_name[strlen(name)] == '@'))
                && !strcmp(dirent->d_name + strlen(dirent->d_name) - 5, ".yang")) {
            path = malloc(strlen(search_dir) + 1 + strlen(dirent->d_name) + 1);
            if (!path) {
                fprintf(stderr, "Memory allocation error (%s).\n", strerror(errno));
                break;
            }
            sprintf(path, "%s/%s", search_dir, dirent->d_name);
            ret = fopen(path, "r");
            free(path);

            if (!ret) {
                fprintf(stderr, "Opening file \"%s\" failed (%s).\n", dirent->d_name, strerror(errno));
            }
            break;
        }
    }

    closedir(dir);
    return ret;
}